

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>::operator()
          (bin_writer<3> *this,
          truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *it)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  wchar_t *pwVar4;
  size_t sVar5;
  long lVar6;
  wchar_t wVar7;
  long lVar8;
  byte *pbVar9;
  long lVar10;
  uint uVar11;
  byte abStack_15 [9];
  char buffer [12];
  
  pwVar4 = (it->super_truncating_iterator_base<wchar_t_*>).out_;
  uVar2 = (it->super_truncating_iterator_base<wchar_t_*>).limit_;
  sVar5 = (it->super_truncating_iterator_base<wchar_t_*>).count_;
  wVar7 = it->blackhole_;
  iVar1 = *(int *)(this + 4);
  lVar6 = (long)iVar1;
  pbVar9 = abStack_15 + lVar6;
  uVar11 = *(uint *)this;
  do {
    *pbVar9 = (byte)uVar11 & 7 | 0x30;
    pbVar9 = pbVar9 + -1;
    bVar3 = 7 < uVar11;
    uVar11 = uVar11 >> 3;
  } while (bVar3);
  if (0 < iVar1) {
    lVar8 = 0;
    do {
      if (sVar5 + lVar8 < uVar2) {
        *pwVar4 = (int)(char)abStack_15[lVar8 + 1];
        lVar10 = 4;
      }
      else {
        lVar10 = 0;
        wVar7 = (int)(char)abStack_15[lVar8 + 1];
      }
      pwVar4 = (wchar_t *)((long)pwVar4 + lVar10);
      lVar8 = lVar8 + 1;
    } while (lVar6 != lVar8);
    sVar5 = sVar5 + lVar6;
  }
  (it->super_truncating_iterator_base<wchar_t_*>).out_ = pwVar4;
  (it->super_truncating_iterator_base<wchar_t_*>).limit_ = uVar2;
  (it->super_truncating_iterator_base<wchar_t_*>).count_ = sVar5;
  it->blackhole_ = wVar7;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<BITS, char_type>(it, abs_value, num_digits);
      }